

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRange.cpp
# Opt level: O3

bool __thiscall iDynTree::optimalcontrol::TimeRange::isInRange(TimeRange *this,double time)

{
  char cVar1;
  byte bVar2;
  double local_30;
  double local_28;
  
  bVar2 = 1;
  if (this->m_anyTime == false) {
    local_30 = time;
    local_28 = time;
    cVar1 = iDynTree::checkDoublesAreEqual(&this->m_initTime,&this->m_endTime,DEFAULT_TOL);
    if (cVar1 == '\0') {
      bVar2 = -(local_28 <= this->m_endTime) & -(this->m_initTime <= local_28);
    }
    else {
      bVar2 = iDynTree::checkDoublesAreEqual(&this->m_initTime,&local_30,DEFAULT_TOL);
    }
  }
  return (bool)(bVar2 & 1);
}

Assistant:

bool TimeRange::isInRange(double time) const
        {
            if (m_anyTime) {
                return true;
            }

            if (isInstant()) {
                return checkDoublesAreEqual(m_initTime, time);
            }

            return ((m_initTime <= time) && (m_endTime >= time));
        }